

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_bitmap.cpp
# Opt level: O3

bool bitmap_operation::BlackGrayScaleImage(void)

{
  bool bVar1;
  Image loaded;
  Image original;
  undefined1 local_88 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  Image local_60;
  string local_38;
  
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            ((ImageTemplate<unsigned_char> *)local_88,0,0,'\x01','\x01');
  Unit_Test::blackImage(&local_60,(Image *)local_88);
  local_88._0_8_ = &PTR__ImageTemplate_00215948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear((ImageTemplate<unsigned_char> *)local_88);
  local_88._0_8_ = local_88 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"bitmap.bmp","");
  Bitmap_Operation::Save((string *)local_88,&local_60);
  if ((undefined1 *)local_88._0_8_ != local_88 + 0x10) {
    operator_delete((void *)local_88._0_8_);
  }
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"bitmap.bmp","");
  Bitmap_Operation::Load((Image *)local_88,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  remove("bitmap.bmp");
  if (((local_60._height == local_88._12_4_) && (local_60._width == local_88._8_4_)) &&
     (local_60._colorCount == local_78._M_local_buf[0])) {
    bVar1 = Unit_Test::verifyImage((Image *)local_88,'\0');
  }
  else {
    bVar1 = false;
  }
  local_88._0_8_ = &PTR__ImageTemplate_00215948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear((ImageTemplate<unsigned_char> *)local_88);
  local_60._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00215948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_60);
  return bVar1;
}

Assistant:

bool BlackGrayScaleImage()
    {
        const PenguinV_Image::Image original = Unit_Test::blackImage();
        Bitmap_Operation::Save( "bitmap.bmp", original );

        const PenguinV_Image::Image loaded = Bitmap_Operation::Load( "bitmap.bmp" );
        remove("bitmap.bmp");

        if( original.height() != loaded.height() || original.width() != loaded.width() ||
            original.colorCount() != loaded.colorCount() || !Unit_Test::verifyImage( loaded, 0u ) )
            return false;

        return true;
    }